

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_setenv_ex
              (LIBSSH2_CHANNEL *channel,char *varname,uint varname_len,char *value,uint value_len)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  uint value_len_local;
  char *value_local;
  uint varname_len_local;
  char *varname_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._0_4_ = channel_setenv(channel,varname,varname_len,value,value_len);
      if ((((int)entry_time != -0x25) || (channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (channel->session->api_block_mode == 0)) break;
      entry_time._0_4_ = _libssh2_wait_socket(channel->session,start_time);
    } while ((int)entry_time == 0);
    channel_local._4_4_ = (int)entry_time;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_setenv_ex(LIBSSH2_CHANNEL *channel,
                          const char *varname, unsigned int varname_len,
                          const char *value, unsigned int value_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_setenv(channel, varname, varname_len,
                                value, value_len));
    return rc;
}